

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerUtil.cpp
# Opt level: O2

shared_ptr<opentracing::v3::Tracer> __thiscall
jaegertracing::testutils::TracerUtil::buildTracer(TracerUtil *this,string *endpoint)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<opentracing::v3::Tracer> sVar1;
  allocator local_564;
  allocator local_563;
  allocator local_562;
  allocator local_561;
  duration local_560;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_558;
  string local_538 [32];
  string local_518;
  duration local_4f8;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  Config local_490;
  Config local_438;
  undefined1 local_3e0 [40];
  duration local_3b8;
  HeadersConfig local_3b0;
  ostringstream samplingServerURLStream;
  Config config;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&samplingServerURLStream);
  std::__cxx11::string::string((string *)&local_4d0,"const",&local_561);
  std::__cxx11::stringbuf::str();
  local_4f8.__r = 0;
  samplers::Config::Config(&local_438,&local_4d0,1.0,&local_4f0,0,&local_4f8);
  local_560.__r = 100000000;
  std::__cxx11::string::string((string *)&local_518,"",&local_562);
  reporters::Config::Config(&local_490,0,&local_560,false,&local_518,endpoint);
  propagation::HeadersConfig::HeadersConfig(&local_3b0);
  std::__cxx11::string::string(local_538,"",&local_563);
  local_3e0[0] = (allocator)0x0;
  std::__cxx11::string::string((string *)(local_3e0 + 8),local_538);
  local_3b8.__r = 0;
  std::__cxx11::string::string((string *)&local_4b0,"",&local_564);
  local_558.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Config::Config(&config,false,&local_438,&local_490,&local_3b0,(RestrictionsConfig *)local_3e0,
                 &local_4b0,&local_558);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_558);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)(local_3e0 + 8));
  std::__cxx11::string::~string(local_538);
  propagation::HeadersConfig::~HeadersConfig(&local_3b0);
  reporters::Config::~Config(&local_490);
  std::__cxx11::string::~string((string *)&local_518);
  samplers::Config::~Config(&local_438);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::string((string *)&local_3b0,"test-service",(allocator *)local_3e0);
  jaegertracing::logging::nullLogger();
  std::__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<jaegertracing::logging::Logger,std::default_delete<jaegertracing::logging::Logger>,void>
            ((__shared_ptr<jaegertracing::logging::Logger,(__gnu_cxx::_Lock_policy)2> *)&local_438,
             (unique_ptr<jaegertracing::logging::Logger,_std::default_delete<jaegertracing::logging::Logger>_>
              *)&local_490);
  Tracer::make((Tracer *)this,&local_3b0._jaegerDebugHeader,&config,
               (shared_ptr<jaegertracing::logging::Logger> *)&local_438);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_438._type._M_string_length);
  if ((long *)local_490._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_490._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)&local_3b0);
  Config::~Config(&config);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&samplingServerURLStream);
  sVar1.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<opentracing::v3::Tracer>)
         sVar1.super___shared_ptr<opentracing::v3::Tracer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<opentracing::Tracer> buildTracer(const std::string& endpoint)
{
    std::ostringstream samplingServerURLStream;
    Config config(
        false,
        samplers::Config("const",
                         1,
                         samplingServerURLStream.str(),
                         0,
                         samplers::Config::Clock::duration()),
        reporters::Config(0,
                          std::chrono::milliseconds(100),
                          false, "", endpoint),
        propagation::HeadersConfig(),
        baggage::RestrictionsConfig());

    auto tracer = Tracer::make("test-service", config, logging::nullLogger());
    return tracer;
}